

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::MakeSegsFromSides(FNodeBuilder *this)

{
  FPrivSeg *pFVar1;
  DWORD DVar2;
  FLevel *pFVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->Level->NumLines == 0) {
    I_Error("Map is empty.\n");
  }
  pFVar3 = this->Level;
  if (0 < pFVar3->NumLines) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      if (*(long *)((long)pFVar3->Lines->sidedef + lVar4) == 0) {
        Printf("Linedef %d does not have a front side.\n",uVar5 & 0xffffffff);
      }
      else {
        CreateSeg(this,(int)uVar5,0);
      }
      if (*(long *)((long)this->Level->Lines->sidedef + lVar4 + 8) != 0) {
        DVar2 = CreateSeg(this,(int)uVar5,1);
        if (*(long *)((long)this->Level->Lines->sidedef + lVar4) != 0) {
          pFVar1 = (this->Segs).Array;
          pFVar1[(int)(DVar2 - 1)].partner = DVar2;
          pFVar1[(int)DVar2].partner = DVar2 - 1;
        }
      }
      uVar5 = uVar5 + 1;
      pFVar3 = this->Level;
      lVar4 = lVar4 + 0x98;
    } while ((long)uVar5 < (long)pFVar3->NumLines);
  }
  return;
}

Assistant:

void FNodeBuilder::MakeSegsFromSides ()
{
	int i, j;

	if (Level.NumLines == 0)
	{
		I_Error ("Map is empty.\n");
	}

	for (i = 0; i < Level.NumLines; ++i)
	{
		if (Level.Lines[i].sidedef[0] != NULL)
		{
			CreateSeg (i, 0);
		}
		else
		{
			Printf ("Linedef %d does not have a front side.\n", i);
		}

		if (Level.Lines[i].sidedef[1] != NULL)
		{
			j = CreateSeg (i, 1);
			if (Level.Lines[i].sidedef[0] != NULL)
			{
				Segs[j-1].partner = j;
				Segs[j].partner = j-1;
			}
		}
	}
}